

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpRenewSubscriptionAsync
              (UpnpClient_Handle Hnd,int TimeOut,char *SubsId,Upnp_FunPtr Fun,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  undefined4 *__s;
  UpnpNonblockParam *Param;
  Handle_Info *SInfo;
  ThreadPoolJob job;
  void *Cookie_const_local;
  Upnp_FunPtr Fun_local;
  char *SubsId_local;
  int TimeOut_local;
  UpnpClient_Handle Hnd_local;
  
  Param = (UpnpNonblockParam *)0x0;
  job._40_8_ = Cookie_const;
  memset(&SInfo,0,0x30);
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x9f3,"Inside UpnpRenewSubscriptionAsync\n");
    HandleReadLock(".upnp/src/api/upnpapi.c",0x9f5);
    UVar1 = GetHandleInfo(Hnd,(Handle_Info **)&Param);
    if (UVar1 == HND_CLIENT) {
      if ((TimeOut == -1) || (0 < TimeOut)) {
        if (SubsId == (char *)0x0) {
          HandleUnlock(".upnp/src/api/upnpapi.c",0xa02);
          TimeOut_local = -0x65;
        }
        else if (Fun == (Upnp_FunPtr)0x0) {
          HandleUnlock(".upnp/src/api/upnpapi.c",0xa06);
          TimeOut_local = -0x65;
        }
        else {
          HandleUnlock(".upnp/src/api/upnpapi.c",0xa09);
          __s = (undefined4 *)malloc(0x760);
          if (__s == (undefined4 *)0x0) {
            TimeOut_local = -0x68;
          }
          else {
            memset(__s,0,0x760);
            *__s = 9;
            __s[1] = Hnd;
            strncpy((char *)(__s + 0x1c3),SubsId,0x2b);
            *(Upnp_FunPtr *)(__s + 0x1d0) = Fun;
            *(undefined8 *)(__s + 0x1ce) = job._40_8_;
            __s[2] = TimeOut;
            TPJobInit((ThreadPoolJob *)&SInfo,UpnpThreadDistribution,__s);
            TPJobSetFreeFunction((ThreadPoolJob *)&SInfo,free);
            TPJobSetPriority((ThreadPoolJob *)&SInfo,MED_PRIORITY);
            iVar2 = ThreadPoolAdd(&gSendThreadPool,(ThreadPoolJob *)&SInfo,(int *)0x0);
            if (iVar2 != 0) {
              free(__s);
            }
            UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa23,
                       "Exiting UpnpRenewSubscriptionAsync\n");
            TimeOut_local = 0;
          }
        }
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x9fe);
        TimeOut_local = -0x65;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0x9fa);
      TimeOut_local = -100;
    }
  }
  else {
    TimeOut_local = -0x74;
  }
  return TimeOut_local;
}

Assistant:

int UpnpRenewSubscriptionAsync(UpnpClient_Handle Hnd,
	int TimeOut,
	Upnp_SID SubsId,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	ThreadPoolJob job;
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpRenewSubscriptionAsync\n");
	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (TimeOut != UPNP_INFINITE && TimeOut < 1) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (SubsId == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (Fun == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	HandleUnlock(__FILE__, __LINE__);

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = RENEW;
	Param->Handle = Hnd;
	strncpy(Param->SubsId, SubsId, sizeof(Param->SubsId) - 1);
	Param->Fun = Fun;
	Param->Cookie = (void *)Cookie_const;
	Param->TimeOut = TimeOut;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free);
	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free(Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpRenewSubscriptionAsync\n");

	return UPNP_E_SUCCESS;
}